

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O2

void ffdhe_compute_exp(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n,uint64_t *sk_n,uint64_t *b_n,
                      uint8_t *res)

{
  long lVar1;
  uint8_t *res_00;
  uint64_t *a_00;
  uint64_t *r2;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t *b;
  uint uVar4;
  uint64_t auStack_70 [4];
  uint8_t *local_50;
  uint64_t *local_48;
  uint64_t *local_40;
  uint64_t *local_38;
  ulong uVar5;
  
  auStack_70[2] = 0x14b776;
  local_50 = res;
  local_48 = sk_n;
  local_40 = b_n;
  uVar2 = ffdhe_len(a);
  uVar4 = uVar2 - 1 & 0xfffffff8;
  uVar5 = (ulong)uVar4;
  local_38 = (uint64_t *)((long)p_r2_n + uVar5 + 8);
  lVar1 = -(uVar5 + 0x17 & 0xfffffffffffffff0);
  b = (uint64_t *)((long)auStack_70 + lVar1 + 0x18);
  *(undefined8 *)((long)auStack_70 + lVar1 + 0x10) = 0x14b7ab;
  memset(b,0,uVar5 + 8);
  uVar3 = *p_r2_n;
  *(undefined8 *)((long)auStack_70 + lVar1 + 0x10) = 0x14b7b4;
  uVar3 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar3);
  *(undefined8 *)((long)auStack_70 + lVar1 + 0x10) = 0x14b7bf;
  uVar2 = ffdhe_len(a);
  r2 = local_38;
  a_00 = local_40;
  *(uint64_t **)((long)auStack_70 + lVar1 + 0x10) = b;
  *(uint64_t **)((long)auStack_70 + lVar1 + 8) = local_48;
  *(undefined8 *)((long)auStack_70 + lVar1) = 0x14b7e6;
  Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
            ((uVar2 - 1 >> 3) + 1,p_r2_n,uVar3,r2,a_00,uVar4 * 8 + 0x40,
             *(uint64_t **)((long)auStack_70 + lVar1 + 8),
             *(uint64_t **)((long)auStack_70 + lVar1 + 0x10));
  *(undefined8 *)((long)auStack_70 + lVar1 + 0x10) = 0x14b7f0;
  uVar2 = ffdhe_len(a);
  res_00 = local_50;
  *(undefined8 *)((long)auStack_70 + lVar1 + 0x10) = 0x14b7fe;
  Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uVar2,b,res_00);
  return;
}

Assistant:

static inline void
ffdhe_compute_exp(
  Spec_FFDHE_ffdhe_alg a,
  uint64_t *p_r2_n,
  uint64_t *sk_n,
  uint64_t *b_n,
  uint8_t *res
)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
  uint64_t res_n[nLen];
  memset(res_n, 0U, nLen * sizeof (uint64_t));
  uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(p_n[0U]);
  Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    p_n,
    mu,
    r2_n,
    b_n,
    64U * nLen,
    sk_n,
    res_n);
  Hacl_Bignum_Convert_bn_to_bytes_be_uint64(ffdhe_len(a), res_n, res);
}